

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O3

sexp sexp_extend_synclo_env(sexp ctx,sexp env)

{
  sexp psVar1;
  sexp psVar2;
  sexp *ppsVar3;
  sexp local_38;
  sexp_gc_var_t local_30;
  
  ppsVar3 = &local_38;
  local_30.var = &local_38;
  local_30.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_30;
  local_38 = env;
  psVar2 = (((ctx->value).opcode.methods)->value).type.slots;
  if ((((ulong)psVar2 & 3) == 0) && (psVar2->tag == 6)) {
    local_38 = sexp_alloc_tagged_aux(ctx,0x28,0x17);
    if (env == (sexp)0x0) {
      ppsVar3 = &(((ctx->value).type.setters)->value).type.print;
      goto LAB_00126305;
    }
    psVar2 = (sexp)0x0;
    do {
      psVar1 = local_38;
      if (psVar2 != (sexp)0x0) {
        psVar1 = sexp_alloc_tagged_aux(ctx,0x28,0x17);
        (psVar2->value).type.name = psVar1;
      }
      (psVar1->value).type.slots = (env->value).type.slots;
      psVar1->field_0x5 = psVar1->field_0x5 | 8;
      (psVar1->value).type.getters = (env->value).type.getters;
      env = (env->value).type.name;
      psVar2 = psVar1;
    } while (env != (sexp)0x0);
    (psVar1->value).flonum = (double)(ctx->value).type.cpl;
  }
  (ctx->value).context.saves = local_30.next;
LAB_00126305:
  return *ppsVar3;
}

Assistant:

sexp sexp_extend_synclo_env (sexp ctx, sexp env) {
  sexp e1, e2;
  sexp_gc_var1(e);
  sexp_gc_preserve1(ctx, e);
  e = env;
  if (sexp_pairp(sexp_context_fv(ctx))) {
    e = sexp_alloc_type(ctx, env, SEXP_ENV);
    for (e1=env, e2=NULL; e1; e1=sexp_env_parent(e1)) {
      e2 = e2 ? (sexp_env_parent(e2) = sexp_alloc_type(ctx, env, SEXP_ENV)) : e;
      sexp_env_bindings(e2) = sexp_env_bindings(e1);
      sexp_env_syntactic_p(e2) = 1;
#if SEXP_USE_STABLE_ABI || SEXP_USE_RENAME_BINDINGS
      sexp_env_renames(e2) = sexp_env_renames(e1);
#endif
    }
    if (!e2) { return sexp_global(ctx, SEXP_G_OOM_ERROR); }
    sexp_env_parent(e2) = sexp_context_env(ctx);
  }
  sexp_gc_release1(ctx);
  return e;
}